

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_transform(SHA256_CTX *ctx,BYTE *data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint auStack_148 [2];
  WORD m [64];
  WORD t2;
  WORD t1;
  WORD j;
  WORD i;
  WORD h;
  WORD g;
  WORD f;
  WORD e;
  WORD d;
  WORD c;
  WORD b;
  WORD a;
  BYTE *data_local;
  SHA256_CTX *ctx_local;
  
  t2 = 0;
  for (t1 = 0; t1 < 0x10; t1 = t1 + 1) {
    auStack_148[t1] =
         (uint)data[t2] << 0x18 | (uint)data[t2 + 1] << 0x10 | (uint)data[t2 + 2] << 8 |
         (uint)data[t2 + 3];
    t2 = t2 + 4;
  }
  for (; t1 < 0x40; t1 = t1 + 1) {
    auStack_148[t1] =
         (((int)auStack_148[t1 + -2] >> 0x11 | auStack_148[t1 + -2] << 0xf) ^
          ((int)auStack_148[t1 + -2] >> 0x13 | auStack_148[t1 + -2] << 0xd) ^
         (int)auStack_148[t1 + -2] >> 10) + auStack_148[t1 + -7] +
         (((int)auStack_148[t1 + -0xf] >> 7 | auStack_148[t1 + -0xf] << 0x19) ^
          ((int)auStack_148[t1 + -0xf] >> 0x12 | auStack_148[t1 + -0xf] << 0xe) ^
         (int)auStack_148[t1 + -0xf] >> 3) + auStack_148[t1 + -0x10];
  }
  c = ctx->state[0];
  d = ctx->state[1];
  e = ctx->state[2];
  f = ctx->state[3];
  g = ctx->state[4];
  h = ctx->state[5];
  i = ctx->state[6];
  j = ctx->state[7];
  for (t1 = 0; t1 < 0x40; t1 = t1 + 1) {
    iVar1 = j + ((g >> 6 | g << 0x1a) ^ (g >> 0xb | g << 0x15) ^ (g >> 0x19 | g << 7)) +
            (g & h ^ (g ^ 0xffffffffU) & i) + k[t1] + auStack_148[t1];
    uVar2 = c & d;
    uVar3 = c & e;
    uVar4 = d & e;
    j = i;
    i = h;
    h = g;
    g = f + iVar1;
    f = e;
    e = d;
    d = c;
    c = iVar1 + ((c >> 2 | c << 0x1e) ^ (c >> 0xd | c << 0x13) ^ (c >> 0x16 | c << 10)) +
                (uVar2 ^ uVar3 ^ uVar4);
  }
  ctx->state[0] = c + ctx->state[0];
  ctx->state[1] = d + ctx->state[1];
  ctx->state[2] = e + ctx->state[2];
  ctx->state[3] = f + ctx->state[3];
  ctx->state[4] = g + ctx->state[4];
  ctx->state[5] = h + ctx->state[5];
  ctx->state[6] = i + ctx->state[6];
  ctx->state[7] = j + ctx->state[7];
  return;
}

Assistant:

static inline void sha256_transform(SHA256_CTX *ctx, const BYTE data[])
{
    WORD a, b, c, d, e, f, g, h, i, j, t1, t2, m[64];

    for (i = 0, j = 0; i < 16; ++i, j += 4)
        m[i] = (data[j] << 24) | (data[j + 1] << 16) | (data[j + 2] << 8) | (data[j + 3]);
    for ( ; i < 64; ++i)
        m[i] = SIG1(m[i - 2]) + m[i - 7] + SIG0(m[i - 15]) + m[i - 16];

    a = ctx->state[0];
    b = ctx->state[1];
    c = ctx->state[2];
    d = ctx->state[3];
    e = ctx->state[4];
    f = ctx->state[5];
    g = ctx->state[6];
    h = ctx->state[7];

    for (i = 0; i < 64; ++i) {
        t1 = h + EP1(e) + CH(e,f,g) + k[i] + m[i];
        t2 = EP0(a) + MAJ(a,b,c);
        h = g;
        g = f;
        f = e;
        e = d + t1;
        d = c;
        c = b;
        b = a;
        a = t1 + t2;
    }

    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}